

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O2

TemporaryCompressionLevel __thiscall
duckdb::TemporaryFileCompressionAdaptivity::GetCompressionLevel
          (TemporaryFileCompressionAdaptivity *this)

{
  long lVar1;
  TemporaryCompressionLevel TVar2;
  TemporaryCompressionLevel TVar3;
  idx_t compression_idx;
  idx_t iVar4;
  idx_t iVar5;
  int64_t iVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  ::std::mutex::lock((mutex *)this);
  iVar6 = this->last_compressed_writes_ns[0];
  iVar5 = 0;
  for (iVar4 = 1; iVar4 != 6; iVar4 = iVar4 + 1) {
    if (this->last_compressed_writes_ns[iVar4] < iVar6) {
      iVar5 = iVar4;
      iVar6 = this->last_compressed_writes_ns[iVar4];
    }
  }
  TVar2 = IndexToLevel(iVar5);
  lVar1 = this->last_uncompressed_write_ns;
  dVar7 = RandomEngine::NextRandom(&this->random_engine);
  dVar8 = RandomEngine::NextRandom(&this->random_engine);
  dVar9 = (double)iVar6 / (double)lVar1;
  pthread_mutex_unlock((pthread_mutex_t *)this);
  if (0.5 <= dVar7) {
    TVar3 = UNCOMPRESSED;
    if (dVar9 < 2.0) {
      TVar3 = TVar2;
    }
    return TVar3;
  }
  if (2.0 <= dVar9) {
    TVar2 = MinimumCompressionLevel();
    return TVar2;
  }
  if (dVar8 < 0.5) {
    return UNCOMPRESSED;
  }
  TVar3 = MaximumCompressionLevel();
  if (TVar2 != TVar3) {
    if (dVar9 < 1.0) {
      iVar5 = iVar5 + 1;
      goto LAB_01589105;
    }
    TVar3 = MinimumCompressionLevel();
    if (TVar2 == TVar3) {
      return UNCOMPRESSED;
    }
  }
  iVar5 = iVar5 - 1;
LAB_01589105:
  TVar2 = IndexToLevel(iVar5);
  return TVar2;
}

Assistant:

TemporaryCompressionLevel TemporaryFileCompressionAdaptivity::GetCompressionLevel() {
	idx_t min_compression_idx = 0;
	TemporaryCompressionLevel level;

	double ratio;
	bool should_compress;

	bool should_deviate;
	bool deviate_uncompressed;
	{
		lock_guard<mutex> guard(random_engine.lock);

		auto min_compressed_time = last_compressed_writes_ns[min_compression_idx];
		for (idx_t compression_idx = 1; compression_idx < LEVELS; compression_idx++) {
			const auto time = last_compressed_writes_ns[compression_idx];
			if (time < min_compressed_time) {
				min_compression_idx = compression_idx;
				min_compressed_time = time;
			}
		}
		level = IndexToLevel(min_compression_idx);

		ratio = static_cast<double>(min_compressed_time) / static_cast<double>(last_uncompressed_write_ns);
		should_compress = ratio < DURATION_RATIO_THRESHOLD;

		should_deviate = random_engine.NextRandom() < COMPRESSION_DEVIATION;
		deviate_uncompressed = random_engine.NextRandom() < 0.5; // Coin flip to deviate with just uncompressed
	}

	TemporaryCompressionLevel result;
	if (!should_deviate) {
		result = should_compress ? level : TemporaryCompressionLevel::UNCOMPRESSED; // Don't deviate
	} else if (!should_compress) {
		result = MinimumCompressionLevel(); // Deviate from uncompressed -> go to fastest level
	} else if (deviate_uncompressed) {
		result = TemporaryCompressionLevel::UNCOMPRESSED;
	} else if (level == MaximumCompressionLevel()) {
		result = IndexToLevel(min_compression_idx - 1); // At highest level, go down one
	} else if (ratio < 1.0) { // Compressed writes are faster, try increasing the compression level
		result = IndexToLevel(min_compression_idx + 1);
	} else { // Compressed writes are slower, try decreasing the compression level
		result = level == MinimumCompressionLevel()
		             ? TemporaryCompressionLevel::UNCOMPRESSED // Already lowest level, go to uncompressed
		             : IndexToLevel(min_compression_idx - 1);
	}
	return result;
}